

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O2

void duckdb::EnumRangeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  idx_t iVar2;
  Vector *this;
  idx_t i;
  idx_t index;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::Value,_true> local_b8;
  LogicalType local_a0;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  
  DataChunk::GetTypes(&types,input);
  pvVar1 = vector<duckdb::LogicalType,_true>::get<true>(&types,0);
  iVar2 = EnumType::GetSize(pvVar1);
  pvVar1 = vector<duckdb::LogicalType,_true>::get<true>(&types,0);
  this = EnumType::GetValuesInsertOrder(pvVar1);
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (index = 0; iVar2 != index; index = index + 1) {
    Vector::GetValue(&val,this,index);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&enum_values,&val);
    Value::~Value(&val);
  }
  LogicalType::LogicalType(&local_a0,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8,
             &enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  Value::LIST(&val,&local_a0,&local_b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  LogicalType::~LogicalType(&local_a0);
  Vector::Reference(result,&val);
  Value::~Value(&val);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&enum_values);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

static void EnumRangeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 1);
	auto enum_size = EnumType::GetSize(types[0]);
	auto &enum_vector = EnumType::GetValuesInsertOrder(types[0]);
	vector<Value> enum_values;
	for (idx_t i = 0; i < enum_size; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}